

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.cpp
# Opt level: O0

void TTD::NSSnapObjects::DoAddtlValueInstantiation_SnapBoxedValue
               (SnapObject *snpObject,RecyclableObject *obj,InflateMap *inflator)

{
  ScriptContext *this;
  void *var;
  JavascriptLibrary *this_00;
  Var local_40;
  Var jsvar;
  TTDVar snapBoxedVar;
  ScriptContext *ctx;
  InflateMap *inflator_local;
  RecyclableObject *obj_local;
  SnapObject *snpObject_local;
  
  this = InflateMap::LookupScriptContext(inflator,snpObject->SnapType->ScriptContextLogId);
  var = SnapObjectGetAddtlInfoAs<void*,(TTD::NSSnapObjects::SnapObjectType)15>(snpObject);
  if (var == (void *)0x0) {
    local_40 = (Var)0x0;
  }
  else {
    local_40 = InflateMap::InflateTTDVar(inflator,var);
  }
  this_00 = Js::ScriptContext::GetLibrary(this);
  Js::JavascriptLibrary::SetBoxedObjectValue_TTD(this_00,obj,local_40);
  return;
}

Assistant:

void DoAddtlValueInstantiation_SnapBoxedValue(const SnapObject* snpObject, Js::RecyclableObject* obj, InflateMap* inflator)
        {
            Js::ScriptContext* ctx = inflator->LookupScriptContext(snpObject->SnapType->ScriptContextLogId);
            TTDVar snapBoxedVar = SnapObjectGetAddtlInfoAs<TTDVar, SnapObjectType::SnapBoxedValueObject>(snpObject);
            Js::Var jsvar = (snapBoxedVar != nullptr) ? inflator->InflateTTDVar(snapBoxedVar) : nullptr;

            ctx->GetLibrary()->SetBoxedObjectValue_TTD(obj, jsvar);
        }